

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_basis_file.cpp
# Opt level: O2

void __thiscall
basisu::basisu_file::create_comp_data(basisu_file *this,basisu_backend_output *encoder_output)

{
  uint8_vec *vec;
  basis_slice_desc *pObjs;
  uchar *puVar1;
  vector<unsigned_char> *pvVar2;
  uint32_t i;
  ulong i_00;
  
  vec = &this->m_comp_data;
  append_vector<basisu::vector<unsigned_char>,unsigned_char>(vec,(uchar *)this,0x4d);
  if ((this->m_comp_data).m_size != this->m_slice_descs_file_ofs) {
    __assert_fail("m_comp_data.size() == m_slice_descs_file_ofs",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                  ,0x98,"void basisu::basisu_file::create_comp_data(const basisu_backend_output &)")
    ;
  }
  pObjs = vector<basist::basis_slice_desc>::operator[](&this->m_images_descs,0);
  append_vector<basisu::vector<unsigned_char>,unsigned_char>
            (vec,(uchar *)pObjs,(ulong)(this->m_images_descs).m_size * 0x17);
  if (encoder_output->m_uses_global_codebooks == false) {
    if ((encoder_output->m_endpoint_palette).m_size != 0) {
      if ((this->m_comp_data).m_size != this->m_endpoint_cb_file_ofs) {
        __assert_fail("m_comp_data.size() == m_endpoint_cb_file_ofs",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                      ,0x9f,
                      "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)");
      }
      puVar1 = vector<unsigned_char>::operator[](&encoder_output->m_endpoint_palette,0);
      append_vector<basisu::vector<unsigned_char>,unsigned_char>
                (vec,puVar1,(ulong)(encoder_output->m_endpoint_palette).m_size);
    }
    if ((encoder_output->m_selector_palette).m_size != 0) {
      if ((this->m_comp_data).m_size != this->m_selector_cb_file_ofs) {
        __assert_fail("m_comp_data.size() == m_selector_cb_file_ofs",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                      ,0xa5,
                      "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)");
      }
      puVar1 = vector<unsigned_char>::operator[](&encoder_output->m_selector_palette,0);
      append_vector<basisu::vector<unsigned_char>,unsigned_char>
                (vec,puVar1,(ulong)(encoder_output->m_selector_palette).m_size);
    }
  }
  if ((encoder_output->m_slice_image_tables).m_size != 0) {
    if ((this->m_comp_data).m_size != this->m_tables_file_ofs) {
      __assert_fail("m_comp_data.size() == m_tables_file_ofs",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                    ,0xac,
                    "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)");
    }
    puVar1 = vector<unsigned_char>::operator[](&encoder_output->m_slice_image_tables,0);
    append_vector<basisu::vector<unsigned_char>,unsigned_char>
              (vec,puVar1,(ulong)(encoder_output->m_slice_image_tables).m_size);
  }
  if ((this->m_comp_data).m_size == this->m_first_image_file_ofs) {
    for (i_00 = 0; i_00 < (encoder_output->m_slice_desc).m_size; i_00 = i_00 + 1) {
      pvVar2 = vector<basisu::vector<unsigned_char>_>::operator[]
                         (&encoder_output->m_slice_image_data,i_00);
      puVar1 = vector<unsigned_char>::operator[](pvVar2,0);
      pvVar2 = vector<basisu::vector<unsigned_char>_>::operator[]
                         (&encoder_output->m_slice_image_data,i_00);
      append_vector<basisu::vector<unsigned_char>,unsigned_char>(vec,puVar1,(ulong)pvVar2->m_size);
    }
    if ((this->m_comp_data).m_size == this->m_total_file_size) {
      return;
    }
    __assert_fail("m_comp_data.size() == m_total_file_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                  ,0xb4,"void basisu::basisu_file::create_comp_data(const basisu_backend_output &)")
    ;
  }
  __assert_fail("m_comp_data.size() == m_first_image_file_ofs",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                ,0xb0,"void basisu::basisu_file::create_comp_data(const basisu_backend_output &)");
}

Assistant:

void basisu_file::create_comp_data(const basisu_backend_output &encoder_output)
	{
		const basisu_backend_slice_desc_vec &slice_descs = encoder_output.m_slice_desc;

		append_vector(m_comp_data, reinterpret_cast<const uint8_t *>(&m_header), sizeof(m_header));

		assert(m_comp_data.size() == m_slice_descs_file_ofs);
		append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&m_images_descs[0]), m_images_descs.size() * sizeof(m_images_descs[0]));

		if (!encoder_output.m_uses_global_codebooks)
		{
			if (encoder_output.m_endpoint_palette.size())
			{
				assert(m_comp_data.size() == m_endpoint_cb_file_ofs);
				append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_endpoint_palette[0]), encoder_output.m_endpoint_palette.size());
			}

			if (encoder_output.m_selector_palette.size())
			{
				assert(m_comp_data.size() == m_selector_cb_file_ofs);
				append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_selector_palette[0]), encoder_output.m_selector_palette.size());
			}
		}

		if (encoder_output.m_slice_image_tables.size())
		{
			assert(m_comp_data.size() == m_tables_file_ofs);
			append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_slice_image_tables[0]), encoder_output.m_slice_image_tables.size());
		}

		assert(m_comp_data.size() == m_first_image_file_ofs);
		for (uint32_t i = 0; i < slice_descs.size(); i++)
			append_vector(m_comp_data, &encoder_output.m_slice_image_data[i][0], encoder_output.m_slice_image_data[i].size());

		assert(m_comp_data.size() == m_total_file_size);
	}